

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O2

void __thiscall bloom_tests::rolling_bloom::test_method(rolling_bloom *this)

{
  long lVar1;
  pointer puVar2;
  uchar *puVar3;
  bool bVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  uint *puVar7;
  int i;
  int iVar8;
  long lVar9;
  ulong uVar10;
  pointer *ppuVar11;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  Span<const_unsigned_char> vKey;
  const_string file;
  Span<const_unsigned_char> vKey_00;
  Span<const_unsigned_char> vKey_01;
  const_string file_00;
  const_string file_01;
  Span<const_unsigned_char> vKey_02;
  const_string file_02;
  Span<const_unsigned_char> vKey_03;
  const_string file_03;
  Span<const_unsigned_char> vKey_04;
  Span<const_unsigned_char> vKey_05;
  const_string file_04;
  Span<const_unsigned_char> vKey_06;
  Span<const_unsigned_char> vKey_07;
  const_string file_05;
  Span<const_unsigned_char> vKey_08;
  Span<const_unsigned_char> vKey_09;
  const_string file_06;
  Span<const_unsigned_char> vKey_10;
  const_string file_07;
  Span<const_unsigned_char> vKey_11;
  check_type cVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar12;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  char *local_2808;
  char *local_2800;
  vector<unsigned_char,_std::allocator<unsigned_char>_> d;
  undefined1 *local_27d8;
  undefined1 *local_27d0;
  char *local_27c8;
  char *local_27c0;
  CRollingBloomFilter rb2;
  char *local_2788;
  char *local_2780;
  undefined1 *local_2778;
  undefined1 *local_2770;
  char *local_2768;
  char *local_2760;
  char *local_2758;
  char *local_2750;
  char *local_2748;
  char *local_2740;
  assertion_result local_2738;
  undefined1 *local_2720;
  undefined1 *local_2718;
  char *local_2710;
  char *local_2708;
  char *local_2700;
  char *local_26f8;
  undefined1 *local_26f0;
  undefined1 *local_26e8;
  char *local_26e0;
  char *local_26d8;
  char *local_26d0;
  char *local_26c8;
  undefined1 *local_26c0;
  undefined1 *local_26b8;
  char *local_26b0;
  char *local_26a8;
  char *local_26a0;
  char *local_2698;
  undefined1 *local_2690;
  undefined1 *local_2688;
  char *local_2680;
  char *local_2678;
  char *local_2670;
  char *local_2668;
  undefined1 *local_2660;
  undefined1 *local_2658;
  char *local_2650;
  char *local_2648;
  char *local_2640;
  char *local_2638;
  undefined1 *local_2630;
  undefined1 *local_2628;
  char *local_2620;
  char *local_2618;
  uint nHits;
  char *local_2608;
  char *local_2600;
  undefined1 *local_25f8;
  undefined1 *local_25f0;
  char *local_25e8;
  char *local_25e0;
  CRollingBloomFilter rb1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data [399];
  
  data[0xe5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data[0x3a].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest((BasicTestingSetup *)this,ZEROS);
  CRollingBloomFilter::CRollingBloomFilter(&rb1,100,0.01);
  memset(data,0,0x2568);
  for (lVar9 = 0; lVar9 != 0x2568; lVar9 = lVar9 + 0x18) {
    BloomTest::RandomData
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rb2,
               &this->super_BOOST_AUTO_TEST_CASE_FIXTURE);
    pvVar12 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              ((long)&data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(pvVar12,&rb2);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&rb2);
    puVar2 = (pvVar12->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    vKey.m_size = *(long *)((long)&data[0].
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + lVar9) -
                  (long)puVar2;
    vKey.m_data = puVar2;
    CRollingBloomFilter::insert(&rb1,vKey);
  }
  for (lVar9 = 0x1c10; lVar9 != 0x2570; lVar9 = lVar9 + 0x18) {
    local_25e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_25e0 = "";
    local_25f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_25f0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x1e0;
    file.m_begin = (iterator)&local_25e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_25f8,msg);
    puVar3 = *(uchar **)((long)data + lVar9 + -8);
    vKey_00.m_size =
         *(long *)((long)&data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar9) - (long)puVar3;
    vKey_00.m_data = puVar3;
    bVar4 = CRollingBloomFilter::contains(&rb1,vKey_00);
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2738._0_8_ = "rb1.contains(data[i])";
    local_2738.m_message.px = (element_type *)0xb6643e;
    rb2.nGeneration._0_1_ = 0;
    rb2._0_8_ = &PTR__lazy_ostream_0113a070;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_2738;
    local_2608 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_2600 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&d,(lazy_ostream *)&rb2,1,0,WARN,_cVar13,(size_t)&local_2608,
               0x1e0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  nHits = 0;
  iVar8 = 10000;
  while (bVar4 = iVar8 != 0, iVar8 = iVar8 + -1, bVar4) {
    BloomTest::RandomData
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rb2,
               &this->super_BOOST_AUTO_TEST_CASE_FIXTURE);
    vKey_01.m_size = CONCAT71(rb2._9_7_,(undefined1)rb2.nGeneration) - rb2._0_8_;
    vKey_01.m_data = (uchar *)rb2._0_8_;
    bVar4 = CRollingBloomFilter::contains(&rb1,vKey_01);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&rb2);
    if (bVar4) {
      nHits = nHits + 1;
    }
  }
  local_2620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2618 = "";
  local_2630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2628 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x1ed;
  file_00.m_begin = (iterator)&local_2620;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2630,
             msg_00);
  rb2.nGeneration._0_1_ = 0;
  rb2._0_8_ = &PTR__lazy_ostream_01139f30;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc694e1;
  local_2640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2638 = "";
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start._4_4_,0x47);
  pvVar12 = &d;
  pvVar5 = (iterator)0x2;
  puVar7 = &nHits;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&rb2,&local_2640,0x1ed,1,2,puVar7,"nHits",pvVar12,"71U");
  local_2650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2648 = "";
  local_2660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2658 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)puVar7;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0x1ef;
  file_01.m_begin = (iterator)&local_2650;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2660,
             msg_01);
  vKey_02.m_size =
       (long)data[0x18e].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)data[0x18e].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  vKey_02.m_data =
       data[0x18e].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  bVar4 = CRollingBloomFilter::contains(&rb1,vKey_02);
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start._1_7_,bVar4);
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2738._0_8_ = "rb1.contains(data[DATASIZE-1])";
  local_2738.m_message.px = (element_type *)0xb66468;
  rb2.nGeneration._0_1_ = 0;
  rb2._0_8_ = &PTR__lazy_ostream_0113a070;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_2738;
  local_2670 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2668 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&d,(lazy_ostream *)&rb2,1,0,WARN,(check_type)pvVar12,
             (size_t)&local_2670,0x1ef);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CRollingBloomFilter::reset(&rb1);
  local_2680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2678 = "";
  local_2690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2688 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x1f1;
  file_02.m_begin = (iterator)&local_2680;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2690,
             msg_02);
  vKey_03.m_size =
       (long)data[0x18e].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)data[0x18e].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  vKey_03.m_data =
       data[0x18e].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  bVar4 = CRollingBloomFilter::contains(&rb1,vKey_03);
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start._1_7_,!bVar4);
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2738._0_8_ = "!rb1.contains(data[DATASIZE-1])";
  local_2738.m_message.px = (element_type *)0xb66468;
  rb2.nGeneration._0_1_ = 0;
  rb2._0_8_ = &PTR__lazy_ostream_0113a070;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_2738;
  local_26a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2698 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&d,(lazy_ostream *)&rb2,1,0,WARN,(check_type)pvVar12,
             (size_t)&local_26a0,0x1f1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ppuVar11 = &data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
  for (uVar10 = 0; uVar10 != 399; uVar10 = uVar10 + 1) {
    if (99 < uVar10) {
      local_26b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_26a8 = "";
      local_26c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_26b8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_03.m_end = pvVar6;
      msg_03.m_begin = pvVar5;
      file_03.m_end = (iterator)0x1f7;
      file_03.m_begin = (iterator)&local_26b0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_26c0,
                 msg_03);
      vKey_04.m_size = (long)ppuVar11[-300] - (long)ppuVar11[-0x12d];
      vKey_04.m_data = ppuVar11[-0x12d];
      bVar4 = CRollingBloomFilter::contains(&rb1,vKey_04);
      d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
      d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2738._0_8_ = "rb1.contains(data[i-100])";
      local_2738.m_message.px = (element_type *)0xb66482;
      rb2.nGeneration._0_1_ = 0;
      rb2._0_8_ = &PTR__lazy_ostream_0113a070;
      rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
      rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_2738;
      local_26d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_26c8 = "";
      pvVar5 = &DAT_00000001;
      pvVar6 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&d,(lazy_ostream *)&rb2,1,0,WARN,(check_type)pvVar12,
                 (size_t)&local_26d0,0x1f7);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    vKey_05.m_size = (long)*ppuVar11 - (long)((_Vector_impl_data *)(ppuVar11 + -1))->_M_start;
    vKey_05.m_data = ((_Vector_impl_data *)(ppuVar11 + -1))->_M_start;
    CRollingBloomFilter::insert(&rb1,vKey_05);
    local_26e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_26d8 = "";
    local_26f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_26e8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = pvVar6;
    msg_04.m_begin = pvVar5;
    file_04.m_end = (iterator)0x1f9;
    file_04.m_begin = (iterator)&local_26e0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_26f0,
               msg_04);
    vKey_06.m_size = (long)*ppuVar11 - (long)((_Vector_impl_data *)(ppuVar11 + -1))->_M_start;
    vKey_06.m_data = ((_Vector_impl_data *)(ppuVar11 + -1))->_M_start;
    bVar4 = CRollingBloomFilter::contains(&rb1,vKey_06);
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2738._0_8_ = "rb1.contains(data[i])";
    local_2738.m_message.px = (element_type *)0xb6643e;
    rb2.nGeneration._0_1_ = 0;
    rb2._0_8_ = &PTR__lazy_ostream_0113a070;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_2738;
    local_2700 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_26f8 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&d,(lazy_ostream *)&rb2,1,0,WARN,(check_type)pvVar12,
               (size_t)&local_2700,0x1f9);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ppuVar11 = ppuVar11 + 3;
  }
  iVar8 = 999;
  this_00 = &d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  while (bVar4 = iVar8 != 0, iVar8 = iVar8 + -1, bVar4) {
    BloomTest::RandomData
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
               &this->super_BOOST_AUTO_TEST_CASE_FIXTURE);
    vKey_07.m_size =
         (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    vKey_07.m_data =
         d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    CRollingBloomFilter::insert(&rb1,vKey_07);
    local_2710 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_2708 = "";
    local_2720 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2718 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar6;
    msg_05.m_begin = pvVar5;
    file_05.m_end = (iterator)0x200;
    file_05.m_begin = (iterator)&local_2710;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2720,
               msg_05);
    vKey_08.m_size =
         (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    vKey_08.m_data =
         d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    bVar4 = CRollingBloomFilter::contains(&rb1,vKey_08);
    local_2738.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar4;
    local_2738.m_message.px = (element_type *)0x0;
    local_2738.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_2748 = "rb1.contains(d)";
    local_2740 = "";
    rb2.nGeneration._0_1_ = 0;
    rb2._0_8_ = &PTR__lazy_ostream_0113a070;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_2748;
    local_2758 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_2750 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_2738,(lazy_ostream *)&rb2,1,0,WARN,(check_type)pvVar12,(size_t)&local_2758,
               0x200);
    boost::detail::shared_count::~shared_count(&local_2738.m_message.pn);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this_00);
  }
  nHits = 0;
  for (lVar9 = 8; lVar9 != 0x2570; lVar9 = lVar9 + 0x18) {
    puVar3 = *(uchar **)((long)data + lVar9 + -8);
    vKey_09.m_size =
         *(long *)((long)&data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar9) - (long)puVar3;
    vKey_09.m_data = puVar3;
    bVar4 = CRollingBloomFilter::contains(&rb1,vKey_09);
    if (bVar4) {
      nHits = nHits + 1;
    }
  }
  local_2768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2760 = "";
  local_2778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2770 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  file_06.m_end = (iterator)0x209;
  file_06.m_begin = (iterator)&local_2768;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2778,
             msg_06);
  rb2.nGeneration._0_1_ = 0;
  rb2._0_8_ = &PTR__lazy_ostream_01139f30;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc694e1;
  local_2788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2780 = "";
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start._4_4_,3);
  pvVar5 = (iterator)0x2;
  puVar7 = &nHits;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&rb2,&local_2788,0x209,1,2,puVar7,"nHits",this_00,"3U");
  CRollingBloomFilter::CRollingBloomFilter(&rb2,1000,0.001);
  for (lVar9 = 8; lVar9 != 0x2570; lVar9 = lVar9 + 0x18) {
    puVar3 = *(uchar **)((long)data + lVar9 + -8);
    vKey_10.m_size =
         *(long *)((long)&data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar9) - (long)puVar3;
    vKey_10.m_data = puVar3;
    CRollingBloomFilter::insert(&rb2,vKey_10);
  }
  for (lVar9 = 8; lVar9 != 0x2570; lVar9 = lVar9 + 0x18) {
    local_27c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_27c0 = "";
    local_27d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_27d0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = (iterator)puVar7;
    msg_07.m_begin = pvVar5;
    file_07.m_end = (iterator)0x212;
    file_07.m_begin = (iterator)&local_27c8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_27d8,
               msg_07);
    puVar3 = *(uchar **)((long)data + lVar9 + -8);
    vKey_11.m_size =
         *(long *)((long)&data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar9) - (long)puVar3;
    vKey_11.m_data = puVar3;
    bVar4 = CRollingBloomFilter::contains(&rb2,vKey_11);
    local_2738.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar4;
    local_2738.m_message.px = (element_type *)0x0;
    local_2738.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_2748 = "rb2.contains(data[i])";
    local_2740 = "";
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "<W\x1b";
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_2808 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_2800 = "";
    pvVar5 = &DAT_00000001;
    puVar7 = (uint *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_2738,(lazy_ostream *)&d,1,0,WARN,(check_type)this_00,(size_t)&local_2808,0x212
              );
    boost::detail::shared_count::~shared_count(&local_2738.m_message.pn);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  lVar9 = 0x2550;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&rb1.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rolling_bloom)
{
    SeedRandomForTest(SeedRand::ZEROS);

    // last-100-entry, 1% false positive:
    CRollingBloomFilter rb1(100, 0.01);

    // Overfill:
    static const int DATASIZE=399;
    std::vector<unsigned char> data[DATASIZE];
    for (int i = 0; i < DATASIZE; i++) {
        data[i] = RandomData();
        rb1.insert(data[i]);
    }
    // Last 100 guaranteed to be remembered:
    for (int i = 299; i < DATASIZE; i++) {
        BOOST_CHECK(rb1.contains(data[i]));
    }

    // false positive rate is 1%, so we should get about 100 hits if
    // testing 10,000 random keys. We get worst-case false positive
    // behavior when the filter is as full as possible, which is
    // when we've inserted one minus an integer multiple of nElement*2.
    unsigned int nHits = 0;
    for (int i = 0; i < 10000; i++) {
        if (rb1.contains(RandomData()))
            ++nHits;
    }
    // Expect about 100 hits
    BOOST_CHECK_EQUAL(nHits, 71U);

    BOOST_CHECK(rb1.contains(data[DATASIZE-1]));
    rb1.reset();
    BOOST_CHECK(!rb1.contains(data[DATASIZE-1]));

    // Now roll through data, make sure last 100 entries
    // are always remembered:
    for (int i = 0; i < DATASIZE; i++) {
        if (i >= 100)
            BOOST_CHECK(rb1.contains(data[i-100]));
        rb1.insert(data[i]);
        BOOST_CHECK(rb1.contains(data[i]));
    }

    // Insert 999 more random entries:
    for (int i = 0; i < 999; i++) {
        std::vector<unsigned char> d = RandomData();
        rb1.insert(d);
        BOOST_CHECK(rb1.contains(d));
    }
    // Sanity check to make sure the filter isn't just filling up:
    nHits = 0;
    for (int i = 0; i < DATASIZE; i++) {
        if (rb1.contains(data[i]))
            ++nHits;
    }
    // Expect about 5 false positives
    BOOST_CHECK_EQUAL(nHits, 3U);

    // last-1000-entry, 0.01% false positive:
    CRollingBloomFilter rb2(1000, 0.001);
    for (int i = 0; i < DATASIZE; i++) {
        rb2.insert(data[i]);
    }
    // ... room for all of them:
    for (int i = 0; i < DATASIZE; i++) {
        BOOST_CHECK(rb2.contains(data[i]));
    }
}